

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  double dVar1;
  void *__ptr;
  void *__ptr_00;
  ulong uVar2;
  double *pdVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int local_44;
  
  dVar8 = pow(eps,0.3333333333333333);
  lVar5 = (long)N;
  __ptr = malloc(lVar5 * 8);
  __ptr_00 = malloc(lVar5 * 8);
  dVar9 = (*funcpt->funcpt)(x,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar9)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    free(__ptr);
    goto LAB_001217ac;
  }
  if (!NAN(dVar9)) {
    uVar6 = 0;
    uVar2 = 0;
    if (0 < N) {
      uVar2 = (ulong)(uint)N;
    }
    for (; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      dVar10 = x[uVar6];
      dVar11 = dVar10;
      if (ABS(dVar10) < 1.0 / ABS(dx[uVar6])) {
        dVar10 = signx(dVar10);
        dVar10 = dVar10 / ABS(dx[uVar6]);
        dVar11 = x[uVar6];
      }
      dVar10 = dVar10 * dVar8 + dVar11;
      x[uVar6] = dVar10;
      *(double *)((long)__ptr + uVar6 * 8) = dVar10 - dVar11;
      dVar10 = (*funcpt->funcpt)(x,N,funcpt->params);
      *(double *)((long)__ptr_00 + uVar6 * 8) = dVar10;
      if (1.79769313486232e+308 <= ABS(dVar10)) goto LAB_00121788;
      if (NAN(dVar10)) goto LAB_00121791;
      x[uVar6] = dVar11;
    }
    local_44 = 1;
    uVar6 = 0;
    pdVar3 = f;
    while( true ) {
      if (uVar6 == uVar2) {
        free(__ptr);
        free(__ptr_00);
        return 0;
      }
      dVar8 = x[uVar6];
      dVar10 = *(double *)((long)__ptr + uVar6 * 8);
      x[uVar6] = dVar10 + dVar10 + dVar8;
      dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar11)) break;
      if (NAN(dVar11)) {
        pcVar4 = "Program Exiting as the function returns NaN";
        goto LAB_001217e7;
      }
      lVar7 = (long)local_44;
      dVar1 = *(double *)((long)__ptr_00 + uVar6 * 8);
      dVar13 = dVar9 - dVar1;
      f[uVar6 * lVar5 + uVar6] = ((dVar11 + dVar13) - dVar1) / (dVar10 * dVar10);
      x[uVar6] = dVar8 + dVar10;
      for (; lVar7 < lVar5; lVar7 = lVar7 + 1) {
        dVar11 = x[lVar7];
        dVar1 = *(double *)((long)__ptr + lVar7 * 8);
        x[lVar7] = dVar11 + dVar1;
        dVar12 = (*funcpt->funcpt)(x,N,funcpt->params);
        if (1.79769313486232e+308 <= ABS(dVar12)) goto LAB_00121788;
        if (NAN(dVar12)) goto LAB_00121791;
        pdVar3[lVar7] =
             ((dVar12 + dVar13) - *(double *)((long)__ptr_00 + lVar7 * 8)) / (dVar1 * dVar10);
        x[lVar7] = dVar11;
      }
      x[uVar6] = dVar8;
      local_44 = local_44 + 1;
      pdVar3 = pdVar3 + lVar5;
      uVar6 = uVar6 + 1;
    }
    pcVar4 = "Program Exiting as the function value exceeds the maximum double value";
LAB_001217e7:
    printf(pcVar4);
    free(__ptr);
    goto LAB_001217ac;
  }
LAB_00121791:
  pcVar4 = "Program Exiting as the function returns NaN";
  goto LAB_00121798;
LAB_00121788:
  pcVar4 = "Program Exiting as the function value exceeds the maximum double value";
LAB_00121798:
  printf(pcVar4);
  free(__ptr);
LAB_001217ac:
  free(__ptr_00);
  return 0xf;
}

Assistant:

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,step,retval;
	double fd,temp,ft,fc,temp2,stepmax;
	double *stepsize,*f2;
	/*
	Returns Upper Triangular matrix only. If you want the full matrix then either use hessian_fd or copy the upper triangular value to lower triangle.
	*/
	fd = pow((double) eps,1.0/3.0);
	
	stepsize = (double*) malloc(sizeof(double) *N);
	f2 = (double*) malloc(sizeof(double) *N);
	retval = 0;
	fc = FUNCPT_EVAL(funcpt,x,N);
	if (fc >= DBL_MAX || fc <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(stepsize);
		free(f2);
		return 15;
	}
	if (fc != fc) {
		printf("Program Exiting as the function returns NaN");
		free(stepsize);
		free(f2);
		return 15;
	}
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= (1.0 / fabs(dx[i]))) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepsize[i] = fd * stepmax;
		temp = x[i];
		x[i] += stepsize[i];
		stepsize[i] = x[i] - temp;
		
		f2[i] = FUNCPT_EVAL(funcpt,x,N);
		if (f2[i] >= DBL_MAX || f2[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (f2[i] != f2[i]) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		x[i] = temp;
	}
	
	for(i = 0; i < N;++i) { 
		step = i *N;
		temp = x[i];
		x[i] += 2*stepsize[i];
		ft = FUNCPT_EVAL(funcpt, x, N);
		if (ft >= DBL_MAX || ft <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (ft != ft) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		f[step+i] = (fc - f2[i] + ft - f2[i])/(stepsize[i] * stepsize[i]);
		x[i] = temp + stepsize[i];
		for(j = i+1; j < N;++j) {
			temp2 = x[j];
			x[j] += stepsize[j];
			ft = FUNCPT_EVAL(funcpt, x, N);
			if (ft >= DBL_MAX || ft <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(stepsize);
				free(f2);
				return 15;
			}
			if (ft != ft) {
				printf("Program Exiting as the function returns NaN");
				free(stepsize);
				free(f2);
				return 15;
			}
			f[step+j] = (fc - f2[i] + ft - f2[j])/(stepsize[i] * stepsize[j]);
			x[j] = temp2;
		}
		x[i] = temp;
			
	}
	
	free(stepsize);
	free(f2);
	return retval;
}